

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void * thread_do(thread *thread_p)

{
  thread_pool *ptVar1;
  job *__ptr;
  bool bVar2;
  job *job_p;
  size_t argsz;
  void *arg;
  _func_void_void_ptr_size_t *func;
  thread_pool_t *pool;
  thread *thread_p_local;
  
  mask_sig();
  ptVar1 = thread_p->thread_pool_p;
  pthread_mutex_lock((pthread_mutex_t *)&ptVar1->thcount_lock);
  ptVar1->num_threads_alive = ptVar1->num_threads_alive + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&ptVar1->thcount_lock);
  while( true ) {
    bVar2 = true;
    if (ptVar1->keepAlive == 0) {
      bVar2 = ptVar1->jobqueue->len != 0;
    }
    if (!bVar2) break;
    bsem_wait(ptVar1->jobqueue->has_jobs);
    if ((ptVar1->keepAlive != 0) || (ptVar1->jobqueue->len != 0)) {
      pthread_mutex_lock((pthread_mutex_t *)&ptVar1->thcount_lock);
      ptVar1->num_threads_working = ptVar1->num_threads_working + 1;
      pthread_mutex_unlock((pthread_mutex_t *)&ptVar1->thcount_lock);
      __ptr = jobqueue_pull(ptVar1->jobqueue);
      if (__ptr != (job *)0x0) {
        (*(__ptr->job).function)((__ptr->job).arg,(__ptr->job).argsz);
        free(__ptr);
      }
      pthread_mutex_lock((pthread_mutex_t *)&ptVar1->thcount_lock);
      ptVar1->num_threads_working = ptVar1->num_threads_working - 1;
      if (ptVar1->num_threads_working == 0) {
        pthread_cond_broadcast((pthread_cond_t *)&ptVar1->threads_idle);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&ptVar1->thcount_lock);
    }
  }
  pthread_mutex_lock((pthread_mutex_t *)&ptVar1->thcount_lock);
  ptVar1->num_threads_alive = ptVar1->num_threads_alive - 1;
  pthread_mutex_unlock((pthread_mutex_t *)&ptVar1->thcount_lock);
  return (void *)0x0;
}

Assistant:

static void *thread_do(thread *thread_p) {
    /* SIGINT should be blocked for thread_pool threads. */
    mask_sig();

    thread_pool_t *pool = thread_p->thread_pool_p;

    pthread_mutex_lock(&pool->thcount_lock);
    pool->num_threads_alive += 1;
    pthread_mutex_unlock(&pool->thcount_lock);

    /* keepAlive will be set to 0 while destroying the thread pool of the thread */
    while (pool->keepAlive || pool->jobqueue->len != 0) {
        bsem_wait(pool->jobqueue->has_jobs);

        if (pool->keepAlive || pool->jobqueue->len != 0) {
            pthread_mutex_lock(&pool->thcount_lock);
            pool->num_threads_working += 1;
            pthread_mutex_unlock(&pool->thcount_lock);

            /* Get job from job queue and process */
            void (*func)(void *, size_t);
            void *arg;
            size_t argsz;

            job *job_p = jobqueue_pull(pool->jobqueue);

            if (job_p != NULL) {
                func = job_p->job.function;
                arg = job_p->job.arg;
                argsz = job_p->job.argsz;

                func(arg, argsz);
                free(job_p);
            }

            pthread_mutex_lock(&pool->thcount_lock);
            pool->num_threads_working -= 1;

            if (!pool->num_threads_working)
                pthread_cond_broadcast(&pool->threads_idle);

            pthread_mutex_unlock(&pool->thcount_lock);
        }
    }

    pthread_mutex_lock(&pool->thcount_lock);
    pool->num_threads_alive -= 1;
    pthread_mutex_unlock(&pool->thcount_lock);

    /* NULL on SUCCESS, thread function should be of type (void *) */
    return NULL;
}